

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_max_fd_shrink(void)

{
  bool bVar1;
  uint local_c;
  uint32_t fd;
  
  fio_lock(&fio_data->lock);
  local_c = fio_data->max_protocol_fd;
  while( true ) {
    bVar1 = false;
    if (local_c != 0) {
      bVar1 = *(long *)((long)fio_data + (ulong)local_c * 0xa8 + 0x58) == 0;
    }
    if (!bVar1) break;
    local_c = local_c - 1;
  }
  fio_data->max_protocol_fd = local_c;
  fio_unlock(&fio_data->lock);
  return;
}

Assistant:

static void fio_max_fd_shrink(void) {
  fio_lock(&fio_data->lock);
  uint32_t fd = fio_data->max_protocol_fd;
  while (fd && fd_data(fd).protocol == NULL)
    --fd;
  fio_data->max_protocol_fd = fd;
  fio_unlock(&fio_data->lock);
}